

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O1

void __thiscall JsonNumber_OneExp2_Test::TestBody(JsonNumber_OneExp2_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  TypedExpectation<std::error_code_(double)> *this_00;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_01;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  Message local_100;
  AssertHelper local_f8;
  string local_f0;
  undefined1 local_d0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  undefined1 local_c0 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  local_b8;
  int local_68;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  puVar2 = (undefined8 *)operator_new(0x20);
  *puVar2 = &PTR__MatcherDescriberInterface_001be9f8;
  puVar2[1] = 0x4059000000000000;
  *(undefined1 *)(puVar2 + 2) = 0;
  puVar2[3] = 0xbff0000000000000;
  local_f0._M_dataplus._M_p = (pointer)&PTR__MatcherBase_001bd138;
  local_f0._M_string_length =
       (size_type)
       testing::internal::MatcherBase<double>::
       GetVTable<testing::internal::MatcherBase<double>::ValuePolicy<testing::MatcherInterface<double>const*,true>>()
       ::kVTable;
  local_f0.field_2._M_allocated_capacity = (size_type)operator_new(0x10);
  *(undefined4 *)local_f0.field_2._M_allocated_capacity = 1;
  *(undefined8 **)(local_f0.field_2._M_allocated_capacity + 8) = puVar2;
  local_f0._M_dataplus._M_p = (pointer)&PTR__MatcherBase_001bdd18;
  mock_json_callbacks::gmock_double_value
            ((MockSpec<std::error_code_(double)> *)local_c0,
             &(this->super_JsonNumber).callbacks_.super_mock_json_callbacks,
             (Matcher<double> *)&local_f0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(double)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(double)> *)local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                       ,0x88,"callbacks_","double_value (DoubleEq (100.0))");
  testing::internal::TypedExpectation<std::error_code_(double)>::Times(this_00,1);
  testing::internal::MatcherBase<double>::~MatcherBase((MatcherBase<double> *)&local_b8);
  testing::internal::MatcherBase<double>::~MatcherBase((MatcherBase<double> *)&local_f0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_c0,
             (this->super_JsonNumber).proxy_.original_,none);
  paVar1 = &local_f0.field_2;
  local_f0.field_2._M_allocated_capacity._0_4_ = 0x326531;
  local_f0._M_string_length = 3;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_d0,3);
  local_c8 = paVar1;
  this_01 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<callbacks_proxy<mock_json_callbacks>> *)local_c0,
                       (span<const_char,__1L> *)local_d0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_d0[0] = local_68 == 0;
  local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (local_68 != 0) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)local_d0,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0x8b,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f8,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_100.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_100.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_c8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b8);
  if (local_c0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c0,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonNumber, OneExp2) {
    EXPECT_CALL (callbacks_, double_value (DoubleEq (100.0))).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input ("1e2"s).eof ();
    EXPECT_FALSE (p.has_error ());
}